

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_3x3.h
# Opt level: O3

void ncnn::conv3x3s1_winograd23_transform_kernel_sse
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  float fVar1;
  undefined4 uVar2;
  float fVar3;
  float fVar4;
  int iVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 (*pauVar13) [16];
  ulong uVar14;
  int iVar15;
  long lVar16;
  undefined1 (*pauVar17) [16];
  undefined1 (*pauVar18) [16];
  ulong uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float tmp [4] [3];
  float afStack_70 [2];
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  afStack_70[0] = 2.19808e-39;
  afStack_70[1] = 0.0;
  Mat::create(kernel_tm,0x10,inch,outch,4,(Allocator *)0x0);
  auVar12 = _DAT_00316960;
  if (0 < outch) {
    pvVar6 = kernel->data;
    iVar5 = kernel_tm->w;
    pauVar13 = (undefined1 (*) [16])kernel_tm->data;
    sVar7 = kernel_tm->elemsize;
    auVar9 = vblendps_avx(_DAT_00316800,_DAT_00316820,2);
    auVar10 = vpermps_avx2(ZEXT1632(_DAT_003168e0),auVar9);
    auVar9 = vblendps_avx(_DAT_00316800,_DAT_00316820,0xc);
    auVar11 = vpermps_avx2(ZEXT1632(_DAT_003168f0),auVar9);
    auVar9 = vblendps_avx(_DAT_00316820,_DAT_00316800,0xf4);
    auVar9 = vpermps_avx2(ZEXT1632(_DAT_00316900),auVar9);
    sVar8 = kernel_tm->cstep;
    uVar14 = 0;
    do {
      if (0 < inch) {
        iVar15 = inch * 9 * (int)uVar14;
        uVar19 = 0;
        pauVar18 = pauVar13;
        do {
          fVar1 = *(float *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4);
          uVar2 = *(undefined4 *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 4);
          auVar28._4_4_ = uVar2;
          auVar28._0_4_ = uVar2;
          auVar28._8_4_ = uVar2;
          auVar28._12_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 8);
          auVar32._4_4_ = uVar2;
          auVar32._0_4_ = uVar2;
          auVar32._8_4_ = uVar2;
          auVar32._12_4_ = uVar2;
          fVar3 = *(float *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 0xc);
          uVar2 = *(undefined4 *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x10);
          auVar36._4_4_ = uVar2;
          auVar36._0_4_ = uVar2;
          auVar36._8_4_ = uVar2;
          auVar36._12_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x14);
          auVar38._4_4_ = uVar2;
          auVar38._0_4_ = uVar2;
          auVar38._8_4_ = uVar2;
          auVar38._12_4_ = uVar2;
          fVar4 = *(float *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x18);
          uVar2 = *(undefined4 *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x1c);
          auVar39._4_4_ = uVar2;
          auVar39._0_4_ = uVar2;
          auVar39._8_4_ = uVar2;
          auVar39._12_4_ = uVar2;
          uVar2 = *(undefined4 *)((long)pvVar6 + uVar19 * 0x24 + (long)iVar15 * 4 + 0x20);
          auVar40._4_4_ = uVar2;
          auVar40._0_4_ = uVar2;
          auVar40._8_4_ = uVar2;
          auVar40._12_4_ = uVar2;
          fVar20 = auVar10._0_4_;
          auVar26._0_4_ = fVar20 * fVar1;
          fVar21 = auVar10._4_4_;
          auVar26._4_4_ = fVar21 * fVar1;
          fVar22 = auVar10._8_4_;
          auVar26._8_4_ = fVar22 * fVar1;
          fVar23 = auVar10._12_4_;
          auVar26._12_4_ = fVar23 * fVar1;
          auVar24 = auVar11._0_16_;
          auVar26 = vfmadd231ps_fma(auVar26,auVar24,auVar28);
          auVar25 = auVar9._0_16_;
          auVar26 = vfmadd231ps_fma(auVar26,auVar25,auVar32);
          auVar29._0_4_ = fVar3 * fVar20;
          auVar29._4_4_ = fVar3 * fVar21;
          auVar29._8_4_ = fVar3 * fVar22;
          auVar29._12_4_ = fVar3 * fVar23;
          auVar28 = vfmadd231ps_fma(auVar29,auVar24,auVar36);
          auVar28 = vfmadd231ps_fma(auVar28,auVar25,auVar38);
          auVar33._0_4_ = fVar4 * fVar20;
          auVar33._4_4_ = fVar4 * fVar21;
          auVar33._8_4_ = fVar4 * fVar22;
          auVar33._12_4_ = fVar4 * fVar23;
          auVar29 = vfmadd231ps_fma(auVar33,auVar24,auVar39);
          auVar29 = vfmadd231ps_fma(auVar29,auVar25,auVar40);
          auVar35._16_16_ = auVar28;
          auVar35._0_16_ = auVar26;
          auVar35 = vpermps_avx2(auVar12,auVar35);
          uVar31 = auVar29._0_8_;
          auVar37._8_8_ = uVar31;
          auVar37._0_8_ = uVar31;
          auVar37._16_8_ = uVar31;
          auVar37._24_8_ = uVar31;
          local_68 = vblendps_avx(auVar35,auVar37,0x24);
          auVar28 = vshufps_avx(auVar26,auVar28,0xff);
          auVar26 = vshufpd_avx(auVar29,auVar29,3);
          local_48 = vblendps_avx(auVar26,auVar28,6);
          lVar16 = 8;
          pauVar17 = pauVar18;
          do {
            fVar1 = *(float *)(local_68 + lVar16 + -8);
            uVar2 = *(undefined4 *)(local_68 + lVar16 + -4);
            auVar30._4_4_ = uVar2;
            auVar30._0_4_ = uVar2;
            auVar30._8_4_ = uVar2;
            auVar30._12_4_ = uVar2;
            uVar2 = *(undefined4 *)(local_68 + lVar16);
            auVar34._4_4_ = uVar2;
            auVar34._0_4_ = uVar2;
            auVar34._8_4_ = uVar2;
            auVar34._12_4_ = uVar2;
            auVar27._0_4_ = fVar20 * fVar1;
            auVar27._4_4_ = fVar21 * fVar1;
            auVar27._8_4_ = fVar22 * fVar1;
            auVar27._12_4_ = fVar23 * fVar1;
            auVar26 = vfmadd231ps_fma(auVar27,auVar24,auVar30);
            auVar26 = vfmadd231ps_fma(auVar26,auVar25,auVar34);
            *pauVar17 = auVar26;
            pauVar17 = pauVar17 + 1;
            lVar16 = lVar16 + 0xc;
          } while (lVar16 != 0x38);
          uVar19 = uVar19 + 1;
          pauVar18 = (undefined1 (*) [16])(*pauVar18 + (long)iVar5 * sVar7);
        } while (uVar19 != (uint)inch);
      }
      uVar14 = uVar14 + 1;
      pauVar13 = (undefined1 (*) [16])(*pauVar13 + sVar8 * sVar7);
    } while (uVar14 != (uint)outch);
  }
  return;
}

Assistant:

static void conv3x3s1_winograd23_transform_kernel_sse(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    kernel_tm.create(4 * 4, inch, outch);

    // G
    const float ktm[4][3] = {
        {1.0f, 0.0f, 0.0f},
        {1.0f / 2, 1.0f / 2, 1.0f / 2},
        {1.0f / 2, -1.0f / 2, 1.0f / 2},
        {0.0f, 0.0f, 1.0f}
    };

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        for (int q = 0; q < inch; q++)
        {
            const float* kernel0 = (const float*)kernel + p * inch * 9 + q * 9;
            float* kernel_tm0 = kernel_tm.channel(p).row(q);

            // transform kernel
            const float* k0 = kernel0;
            const float* k1 = kernel0 + 3;
            const float* k2 = kernel0 + 6;

            // h
            float tmp[4][3];
            for (int i = 0; i < 4; i++)
            {
                tmp[i][0] = k0[0] * ktm[i][0] + k0[1] * ktm[i][1] + k0[2] * ktm[i][2];
                tmp[i][1] = k1[0] * ktm[i][0] + k1[1] * ktm[i][1] + k1[2] * ktm[i][2];
                tmp[i][2] = k2[0] * ktm[i][0] + k2[1] * ktm[i][1] + k2[2] * ktm[i][2];
            }

            // U
            for (int j = 0; j < 4; j++)
            {
                float* tmpp = &tmp[j][0];

                for (int i = 0; i < 4; i++)
                {
                    kernel_tm0[j * 4 + i] = tmpp[0] * ktm[i][0] + tmpp[1] * ktm[i][1] + tmpp[2] * ktm[i][2];
                }
            }
        }
    }
}